

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int tx_get_length(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,size_t *written,
                 _Bool is_elements)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  size_t witness_count;
  size_t witness_size;
  size_t base_size;
  
  iVar3 = -2;
  if (written != (size_t *)0x0) {
    *written = 0;
    iVar1 = tx_get_lengths(tx,opts,flags,&base_size,&witness_size,&witness_count,is_elements);
    if (iVar1 == 0) {
      if (witness_count != 0) {
        witness_count = witness_size;
      }
      iVar3 = 0;
      sVar2 = 0;
      if ((flags & 1) != 0) {
        sVar2 = witness_count;
      }
      *written = sVar2 + base_size;
    }
  }
  return iVar3;
}

Assistant:

static int tx_get_length(const struct wally_tx *tx,
                         const struct tx_serialize_opts *opts, uint32_t flags,
                         size_t *written, bool is_elements)
{
    size_t base_size, witness_size, witness_count;

    if (written)
        *written = 0;

    if (!written ||
        tx_get_lengths(tx, opts, flags, &base_size, &witness_size,
                       &witness_count, is_elements) != WALLY_OK)
        return WALLY_EINVAL;

    if (witness_count && (flags & WALLY_TX_FLAG_USE_WITNESS))
        *written = base_size + witness_size;
    else
        *written = base_size;

    return WALLY_OK;
}